

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O3

void * chaiscript::detail::verify_type<void>(Boxed_Value *ob,type_info *ti,void *ptr)

{
  bool bVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  bVar1 = Type_Info::bare_equal_type_info((Type_Info *)ob,ti);
  if (bVar1) {
    pvVar2 = throw_if_null<void_const>(ptr);
    return pvVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__bad_cast_0059ed90;
  __cxa_throw(puVar3,&exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static const T *verify_type(const Boxed_Value &ob, const std::type_info &ti, const T *ptr) {
      if (ob.get_type_info().bare_equal_type_info(ti)) {
        return throw_if_null(ptr);
      } else {
        throw chaiscript::detail::exception::bad_any_cast();
      }
    }